

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O1

String * Error::getErrorString(String *__return_storage_ptr__,uint error)

{
  usize *puVar1;
  code *pcVar2;
  int iVar3;
  char *start;
  long lVar4;
  char *pcVar5;
  Iterator IVar6;
  usize length;
  long lVar7;
  bool bVar8;
  String local_38;
  
  if (error == 0x10000) {
    __return_storage_ptr__->data = &String::emptyData.super_Data;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&Private::mutex);
    if (iVar3 != 0) {
      iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Error.cpp"
                            ,0x77,"pthread_mutex_lock(&Private::mutex) == 0");
      if (iVar3 != 0) goto LAB_0011161f;
    }
    lVar4 = syscall(0xba);
    bVar8 = Private::userErrorStrings.root == (Item *)0x0;
    IVar6.item = Private::userErrorStrings.root;
    if (!bVar8) {
      bVar8 = false;
      do {
        lVar7 = 0x28;
        if (((uint)lVar4 <= (IVar6.item)->key) && (lVar7 = 0x20, (IVar6.item)->key <= (uint)lVar4))
        break;
        IVar6.item = *(Item **)((long)&(IVar6.item)->key + lVar7);
        bVar8 = IVar6.item == (Item *)0x0;
      } while (!bVar8);
    }
    if (bVar8) {
      IVar6 = Private::userErrorStrings._end;
    }
    if (IVar6.item != Private::userErrorStrings._end.item) {
      pcVar5 = ((IVar6.item)->value)._ptr;
      if (pcVar5 == (char *)0x0) {
        local_38.data = &String::emptyData.super_Data;
      }
      else {
        String::String(&local_38,pcVar5,((IVar6.item)->value)._len);
      }
      String::operator=(__return_storage_ptr__,&local_38);
      if ((local_38.data)->ref != 0) {
        LOCK();
        puVar1 = &(local_38.data)->ref;
        *puVar1 = *puVar1 - 1;
        UNLOCK();
        if ((*puVar1 == 0) && (local_38.data != (Data *)0x0)) {
          operator_delete__(local_38.data);
        }
      }
    }
    iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&Private::mutex);
    if (iVar3 != 0) {
      iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Error.cpp"
                            ,0x85,"pthread_mutex_unlock(&Private::mutex) == 0");
      if (iVar3 != 0) {
LAB_0011161f:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
  }
  else {
    pcVar5 = strerror(error);
    length = 0xffffffffffffffff;
    do {
      lVar4 = length + 1;
      length = length + 1;
    } while (pcVar5[lVar4] != '\0');
    String::String(__return_storage_ptr__,pcVar5,length);
  }
  return __return_storage_ptr__;
}

Assistant:

String Error::getErrorString(uint error)
{
  if(error == 0x10000)
  {
    String errorStr;
#ifdef _WIN32
    EnterCriticalSection(&Private::cs);
#else
    VERIFY(pthread_mutex_lock(&Private::mutex) == 0);
#endif

#ifdef _WIN32
    uint32 threadId = (uint32)GetCurrentThreadId();
#else
    uint32 threadId = (uint32)syscall(__NR_gettid);
#endif
    Map<uint32, Error::Private::Str>::Iterator it = Private::userErrorStrings.find(threadId);
    if(it != Private::userErrorStrings.end())
      errorStr = *it;
#ifdef _WIN32
    LeaveCriticalSection(&Private::cs);
#else
    VERIFY(pthread_mutex_unlock(&Private::mutex) == 0);
#endif
    return errorStr;
  }

#ifdef _WIN32
  TCHAR errorMessage[256];
  DWORD len = FormatMessage(
        FORMAT_MESSAGE_FROM_SYSTEM |
        FORMAT_MESSAGE_IGNORE_INSERTS,
        NULL,
        error,
        MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
        (LPTSTR) errorMessage,
        256, NULL );
  ASSERT(len >= 0 && len <= 256);
  while(len > 0 && String::isSpace(errorMessage[len - 1]))
    --len;
  errorMessage[len] = '\0';
  return String(errorMessage, len);
#else
  const char* errorMessage = strerror(error);
  return String(errorMessage, String::length(errorMessage));
#endif
}